

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_mset_wire_format.pb.cc
# Opt level: O2

void __thiscall proto2_wireformat_unittest::TestMessageSet::~TestMessageSet(TestMessageSet *this)

{
  ~TestMessageSet(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TestMessageSet::~TestMessageSet() {
  // @@protoc_insertion_point(destructor:proto2_wireformat_unittest.TestMessageSet)
  SharedDtor(*this);
}